

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v10::detail::
         write_significand<fmt::v10::appender,char,unsigned_int,fmt::v10::detail::digit_grouping<char>>
                   (appender out,uint significand,int significand_size,int integral_size,
                   char decimal_point,digit_grouping<char> *grouping)

{
  bool bVar1;
  type tVar2;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> out_00;
  undefined8 in_RDI;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  digit_grouping<char> *in_stack_000005d0;
  basic_string_view<char> in_stack_000005d8;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> in_stack_000005e8;
  buffer<char> *in_stack_fffffffffffffd28;
  buffer<char> *this;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  undefined8 in_stack_fffffffffffffd38;
  undefined8 in_stack_fffffffffffffd40;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> in_stack_fffffffffffffd48;
  basic_string_view<char> local_290;
  undefined8 local_280;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_278;
  allocator<char> local_251;
  buffer<char> local_250 [16];
  undefined8 local_38;
  undefined8 local_18;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_10;
  buffer<char> *local_8;
  
  local_18 = in_RDI;
  bVar1 = digit_grouping<char>::has_separator((digit_grouping<char> *)0x36cd23);
  if (bVar1) {
    std::allocator<char>::allocator();
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
              (in_stack_fffffffffffffd30,(allocator<char> *)in_stack_fffffffffffffd28);
    std::allocator<char>::~allocator(&local_251);
    appender::back_insert_iterator((appender *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    local_278.container =
         (buffer<char> *)
         write_significand<fmt::v10::appender,_unsigned_int,_char,_0>
                   (in_stack_fffffffffffffd48.container,
                    (uint)((ulong)in_stack_fffffffffffffd40 >> 0x20),(int)in_stack_fffffffffffffd40,
                    (int)((ulong)in_stack_fffffffffffffd38 >> 0x20),
                    (char)((ulong)in_stack_fffffffffffffd38 >> 0x18));
    local_280 = local_18;
    out_00.container = (buffer<char> *)buffer<char>::data(local_250);
    tVar2 = to_unsigned<int>(0);
    basic_string_view<char>::basic_string_view(&local_290,(char *)out_00.container,(ulong)tVar2);
    digit_grouping<char>::apply<fmt::v10::appender,char>
              (in_stack_000005d0,(appender)in_stack_000005e8.container,in_stack_000005d8);
    this = local_250;
    buffer<char>::data(this);
    local_8 = this;
    local_10.container =
         (buffer<char> *)
         copy_str_noinline<char,char*,fmt::v10::appender>
                   ((char *)in_stack_fffffffffffffd30,this,out_00.container);
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
              ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_10.container);
  }
  else {
    local_38 = local_18;
    local_10.container =
         (buffer<char> *)
         write_significand<fmt::v10::appender,_unsigned_int,_char,_0>
                   (in_stack_fffffffffffffd48.container,
                    (uint)((ulong)in_stack_fffffffffffffd40 >> 0x20),(int)in_stack_fffffffffffffd40,
                    (int)((ulong)in_stack_fffffffffffffd38 >> 0x20),
                    (char)((ulong)in_stack_fffffffffffffd38 >> 0x18));
  }
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)local_10.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int integral_size,
                                       Char decimal_point,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.has_separator()) {
    return write_significand(out, significand, significand_size, integral_size,
                             decimal_point);
  }
  auto buffer = basic_memory_buffer<Char>();
  write_significand(buffer_appender<Char>(buffer), significand,
                    significand_size, integral_size, decimal_point);
  grouping.apply(
      out, basic_string_view<Char>(buffer.data(), to_unsigned(integral_size)));
  return detail::copy_str_noinline<Char>(buffer.data() + integral_size,
                                         buffer.end(), out);
}